

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O0

void floor0_map_lazy_init(vorbis_block *vb,vorbis_info_floor *infoX,vorbis_look_floor0 *look)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_54;
  int val;
  float scale;
  int j;
  int n;
  int W;
  vorbis_info_floor0 *info;
  codec_setup_info *ci;
  vorbis_info *vi;
  vorbis_dsp_state *vd;
  vorbis_look_floor0 *look_local;
  vorbis_info_floor *infoX_local;
  vorbis_block *vb_local;
  
  if (look->linearmap[vb->W] == (int *)0x0) {
    iVar3 = (int)vb->W;
    iVar4 = (int)(*(long *)((long)vb->vd->vi->codec_setup + (long)iVar3 * 8) / 2);
    iVar1 = look->ln;
    dVar6 = atan((double)(((float)*(long *)((long)infoX + 8) / 2.0) * 0.00074));
    dVar7 = atan((double)(((float)*(long *)((long)infoX + 8) / 2.0) *
                          ((float)*(long *)((long)infoX + 8) / 2.0) * 1.85e-08));
    lVar2 = *(long *)((long)infoX + 8);
    piVar5 = (int *)malloc((long)(iVar4 + 1) << 2);
    look->linearmap[iVar3] = piVar5;
    for (val = 0; val < iVar4; val = val + 1) {
      dVar8 = atan((double)((((float)*(long *)((long)infoX + 8) / 2.0) / (float)iVar4) * (float)val
                           * 0.00074));
      dVar9 = atan((double)((((float)*(long *)((long)infoX + 8) / 2.0) / (float)iVar4) * (float)val
                            * (((float)*(long *)((long)infoX + 8) / 2.0) / (float)iVar4) *
                              (float)val * 1.85e-08));
      dVar8 = floor((dVar8 * 13.100000381469727 + dVar9 * 2.240000009536743 +
                    (double)((((float)*(long *)((long)infoX + 8) / 2.0) / (float)iVar4) * (float)val
                            * 0.0001)) *
                    (double)(float)((double)iVar1 /
                                   (dVar6 * 13.100000381469727 + dVar7 * 2.240000009536743 +
                                   (double)(((float)lVar2 / 2.0) * 0.0001))));
      local_54 = (int)dVar8;
      if (look->ln <= local_54) {
        local_54 = look->ln + -1;
      }
      look->linearmap[iVar3][val] = local_54;
    }
    look->linearmap[iVar3][val] = -1;
    look->n[iVar3] = iVar4;
  }
  return;
}

Assistant:

static void floor0_map_lazy_init(vorbis_block      *vb,
                                 vorbis_info_floor *infoX,
                                 vorbis_look_floor0 *look){
  if(!look->linearmap[vb->W]){
    vorbis_dsp_state   *vd=vb->vd;
    vorbis_info        *vi=vd->vi;
    codec_setup_info   *ci=vi->codec_setup;
    vorbis_info_floor0 *info=(vorbis_info_floor0 *)infoX;
    int W=vb->W;
    int n=ci->blocksizes[W]/2,j;

    /* we choose a scaling constant so that:
       floor(bark(rate/2-1)*C)=mapped-1
     floor(bark(rate/2)*C)=mapped */
    float scale=look->ln/toBARK(info->rate/2.f);

    /* the mapping from a linear scale to a smaller bark scale is
       straightforward.  We do *not* make sure that the linear mapping
       does not skip bark-scale bins; the decoder simply skips them and
       the encoder may do what it wishes in filling them.  They're
       necessary in some mapping combinations to keep the scale spacing
       accurate */
    look->linearmap[W]=_ogg_malloc((n+1)*sizeof(**look->linearmap));
    for(j=0;j<n;j++){
      int val=floor( toBARK((info->rate/2.f)/n*j)
                     *scale); /* bark numbers represent band edges */
      if(val>=look->ln)val=look->ln-1; /* guard against the approximation */
      look->linearmap[W][j]=val;
    }
    look->linearmap[W][j]=-1;
    look->n[W]=n;
  }
}